

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O2

void __thiscall common::SSH2Client::Shutdown(SSH2Client *this)

{
  Log *this_00;
  allocator local_31;
  string local_30;
  
  if (this->channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_channel_free(this->channel);
    this->channel = (LIBSSH2_CHANNEL *)0x0;
  }
  if (this->session != (LIBSSH2_SESSION *)0x0) {
    libssh2_session_disconnect_ex(this->session,0xb,"Normal Shutdown, Thank you for playing","");
    libssh2_session_free(this->session);
    this->session = (LIBSSH2_SESSION *)0x0;
  }
  if (0 < this->sock) {
    close(this->sock);
  }
  libssh2_exit();
  this_00 = xlib::Log::Instance();
  std::__cxx11::string::string((string *)&local_30,"all done",&local_31);
  xlib::Log::SWrite<>(this_00,LOG_PRIORITY_DEBUG,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                      ,0x8d,"Shutdown",true,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SSH2Client::Shutdown() {
    if (channel != NULL) {
        libssh2_channel_free(channel);
        channel = NULL;
    }
    if (session != NULL) {
        libssh2_session_disconnect(session,
                                   "Normal Shutdown, Thank you for playing");
        libssh2_session_free(session);
        session = NULL;
    }
    if (sock > 0) {
        close(sock);
    }
    libssh2_exit();
    XDBG("all done");
}